

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O3

void __thiscall sfc::Tile::Tile(Tile *this,Image *image,Mode mode,uint bpp,bool no_flip)

{
  index_vec_t *this_00;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *this_01;
  int iVar4;
  runtime_error *this_02;
  Tile *pTVar5;
  byte *pbVar6;
  byte bVar7;
  byte local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  Tile *local_48;
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  *local_40;
  rgba_vec_t *local_38;
  
  this->_mode = mode;
  this->_bpp = bpp;
  uVar1 = image->_height;
  this->_width = image->_width;
  this->_height = uVar1;
  this_00 = &this->_data;
  local_40 = (vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->_mirrors;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mirrors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mirrors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mirrors).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_palette,&image->_palette)
  ;
  local_38 = &this->_palette;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,&image->_indexed_data);
  puVar3 = local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar5 = local_48;
  if (puVar2 == puVar3) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"Can\'t create tile without indexed data");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar7 = 1;
  if (1 < local_48->_bpp) {
    iVar4 = local_48->_bpp - 1;
    bVar7 = 1;
    do {
      bVar7 = bVar7 * '\x02' | bVar7;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,&image->_indexed_data);
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pbVar6 = local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_61 = *pbVar6 & bVar7;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (this_00,&local_61);
      pbVar6 = pbVar6 + 1;
      pTVar5 = local_48;
    } while (pbVar6 != local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  this_01 = local_40;
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (!no_flip) {
    mirror<unsigned_char>(&local_60,this_00,pTVar5->_width,true,false);
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>(this_01,&local_60);
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    mirror<unsigned_char>(&local_60,this_00,pTVar5->_width,false,true);
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>(this_01,&local_60);
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    mirror<unsigned_char>(&local_60,this_00,pTVar5->_width,true,true);
    std::
    vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>(this_01,&local_60);
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

Tile::Tile(const Image& image, Mode mode, unsigned bpp, bool no_flip)
    : _mode(mode), _bpp(bpp), _width(image.width()), _height(image.height()), _palette(image.palette()) {
  if (image.indexed_data().empty())
    throw std::runtime_error("Can't create tile without indexed data");

  index_t mask = bitmask_at_bpp(_bpp);
  for (index_t ip : image.indexed_data())
    _data.push_back(ip & mask);

  if (!no_flip) {
    _mirrors.push_back(mirror(_data, _width, true, false));
    _mirrors.push_back(mirror(_data, _width, false, true));
    _mirrors.push_back(mirror(_data, _width, true, true));
  }
}